

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O1

bool __thiscall
DatetimeParser::initializeNthDayInMonth
          (DatetimeParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  string *token;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int ordinal;
  char local_1d;
  int local_1c;
  
  token = (tokens->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(tokens->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)token == 0x80) {
    local_1c = 0;
    bVar1 = isOrdinal(this,token,&local_1c);
    if ((((bVar1) &&
         (iVar2 = Datetime::dayOfWeek((tokens->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1), iVar2 != -1))
        && ((iVar3 = std::__cxx11::string::compare
                               ((char *)((tokens->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 2)),
            iVar3 == 0 ||
            (iVar3 = std::__cxx11::string::compare
                               ((char *)((tokens->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 2)),
            iVar3 == 0)))) &&
       (iVar3 = Datetime::monthOfYear
                          ((tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 3), iVar3 != -1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# ordinal=",10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," day=",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in month=",10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      local_1d = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1d,1);
      return true;
    }
  }
  return false;
}

Assistant:

bool DatetimeParser::initializeNthDayInMonth (const std::vector <std::string>& tokens)
{
  if (tokens.size () == 4)
  {
    int ordinal {0};
    if (isOrdinal (tokens[0], ordinal))
    {
      auto day = Datetime::dayOfWeek (tokens[1]);
      if (day != -1)
      {
        if (tokens[2] == "in" ||
            tokens[2] == "of")
        {
          auto month = Datetime::monthOfYear (tokens[3]);
          if (month != -1)
          {
            std::cout << "# ordinal=" << ordinal << " day=" << day << " in month=" << month << '\n';

            // TODO Assume 1st of the month
            // TODO Assume current year
            // TODO Determine the day
            // TODO Project forwards/backwards, to the desired day
            // TODO Add ((ordinal - 1) * 7) days

            return true;
          }
        }
      }
    }
  }

  return false;
}